

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall
clunk::Node::GetSliderDiscovers(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  char cVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint to;
  uint to_00;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6f9,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fa,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  pbVar2 = (byte *)(&_board)[(uint)from];
  if (pbVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fb,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((color | type) != (uint)*pbVar2) {
    __assert_fail("_board[from]->type == (color|type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fc,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)pbVar2[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fd,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  iVar3 = GetPinDir(this,color,from);
  do {
    if (mvs == 0) {
      return;
    }
    if ((mvs & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x700,
                    "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                   );
    }
    to_00 = (int)(mvs & 0xff) - 1;
    iVar4 = Direction(from,to_00);
    if ((0x22 < iVar4 + 0x11U) || ((0x700050007U >> ((ulong)(iVar4 + 0x11U) & 0x3f) & 1) == 0)) {
      __assert_fail("IS_DIR(dir)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x703,
                    "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                   );
    }
    iVar5 = -iVar4;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    if ((iVar3 == 0) || (iVar5 == iVar3)) {
      uVar6 = from;
      do {
        to = iVar4 + uVar6;
        if ((to & 0xffffff88) != 0) {
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x706,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        iVar5 = Direction(from,to);
        if (iVar5 != iVar4) {
          __assert_fail("Direction(from, to) == dir",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x707,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        cVar1 = *(char *)(&_board)[to];
        if ((cVar1 == '\0') && ((char *)(&_board)[to] != _EMPTY)) {
          __assert_fail("cap || (_board[to] == _EMPTY)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x709,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        if (cVar1 != '\0') break;
        cVar1 = _kingDir[uVar6 + (uint)!color * 8 + iVar4];
        if (type == BishopMove) {
          if (((cVar1 != '\x0f') && (cVar1 != '\x11')) && ((cVar1 != -0x11 && (cVar1 != -0xf)))) {
LAB_0012d786:
            AddMove(this,type,from,to,
                    (*(int *)(_SQR + (ulong)to * 4) - *(int *)(_SQR + (ulong)(uint)from * 4)) + 10,0
                    ,0);
          }
        }
        else if ((((cVar1 != '\x01') && (cVar1 != '\x10')) && (cVar1 != -0x10)) && (cVar1 != -1))
        goto LAB_0012d786;
        uVar6 = to;
      } while (to_00 != to);
    }
    mvs = mvs >> 8;
  } while( true );
}

Assistant:

void GetSliderDiscovers(const Color color, const MoveType type,
                          uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    while (mvs) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = (Direction(from, end));
      assert(IS_DIR(dir));
      if (!pinDir || (abs(dir) == pinDir)) {
        for (int to = (from + dir);; to += dir) {
          assert(IS_SQUARE(to));
          assert(Direction(from, to) == dir);
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if (!cap) {
            if ((type == BishopMove) ? !IS_DIAG(_kingDir[to + (8 * !color)])
                                     : !IS_CROSS(_kingDir[to + (8 * !color)]))
            {
              const int score = (_SQR[to] - _SQR[from] + 10);
              AddMove(type, from, to, score);
            }
          }
          else {
            break;
          }
          if (to == end) {
            break;
          }
        }
      }
      mvs >>= 8;
    }
  }